

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFile.cpp
# Opt level: O3

void __thiscall ObjectFile::refresh(ObjectFile *this,bool isFirstTime)

{
  map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
  *this_00;
  pointer pcVar1;
  bool bVar2;
  mapped_type *ppOVar3;
  OSAttribute *pOVar4;
  int iVar5;
  int in_EDX;
  char *format;
  bool value;
  File objectFile;
  unsigned_long osAttrType;
  unsigned_long curGen;
  MutexLocker lock;
  unsigned_long p11AttrType;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_e8;
  _func_int **local_b8;
  File local_b0;
  unsigned_long local_78;
  unsigned_long local_70;
  MutexLocker local_68;
  unsigned_long local_58;
  string local_50;
  
  if (this->inTransaction == true) {
    format = "The object is in a transaction";
    iVar5 = 0x121;
LAB_001332da:
    softHSMLog(7,"refresh",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
               ,iVar5,format);
    return;
  }
  if (!isFirstTime) {
    if (this->token != (OSToken *)0x0) {
      OSToken::index(this->token,(char *)0x0,in_EDX);
    }
    if ((this->gen == (Generation *)0x0) || (bVar2 = Generation::wasUpdated(this->gen), !bVar2)) {
      format = "The object generation has not been updated";
      iVar5 = 0x130;
      goto LAB_001332da;
    }
  }
  pcVar1 = (this->path)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (this->path)._M_string_length);
  File::File(&local_b0,&local_50,this->umask,true,false,false,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  bVar2 = File::isValid(&local_b0);
  if (!bVar2) {
    softHSMLog(7,"refresh",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
               ,0x139,"Object %s is invalid",(this->path)._M_dataplus._M_p);
    this->valid = false;
    goto LAB_00133743;
  }
  File::lock(&local_b0,true);
  bVar2 = File::isEmpty(&local_b0);
  pcVar1 = (this->path)._M_dataplus._M_p;
  if (bVar2) {
    softHSMLog(7,"refresh",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
               ,0x144,"Object %s is empty",pcVar1);
    File::unlock(&local_b0);
    goto LAB_00133743;
  }
  softHSMLog(7,"refresh",
             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
             ,0x14b,"Object %s has changed",pcVar1);
  discardAttributes(this);
  MutexLocker::MutexLocker(&local_68,this->objectMutex);
  bVar2 = File::readULong(&local_b0,&local_70);
  if (bVar2) {
    Generation::set(this->gen,local_70);
LAB_0013339f:
    this_00 = &this->attributes;
    local_b8 = (_func_int **)&PTR__ByteString_00151bd0;
LAB_001333c5:
    bVar2 = File::isEOF(&local_b0);
    if (!bVar2) {
      bVar2 = File::readULong(&local_b0,&local_58);
      if (!bVar2) {
        bVar2 = File::isEOF(&local_b0);
        iVar5 = 0x174;
        if (!bVar2) {
LAB_00133703:
          softHSMLog(7,"refresh",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                     ,iVar5,"Corrupt object file %s",(this->path)._M_dataplus._M_p);
LAB_00133728:
          this->valid = false;
          File::unlock(&local_b0);
          goto LAB_00133736;
        }
        goto LAB_001336ee;
      }
      bVar2 = File::readULong(&local_b0,&local_78);
      if (!bVar2) {
        iVar5 = 0x17f;
        goto LAB_00133703;
      }
      switch(local_78) {
      case 1:
        bVar2 = File::readBool(&local_b0,(bool *)&local_e8);
        if (!bVar2) {
          softHSMLog(7,"refresh",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                     ,399,"Corrupt object file %s",(this->path)._M_dataplus._M_p);
          this->valid = false;
          File::unlock(&local_b0);
          goto LAB_00133736;
        }
        ppOVar3 = std::
                  map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                  ::operator[](this_00,&local_58);
        if (*ppOVar3 != (mapped_type)0x0) {
          ppOVar3 = std::
                    map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                    ::operator[](this_00,&local_58);
          if (*ppOVar3 != (mapped_type)0x0) {
            (*(*ppOVar3)->_vptr_OSAttribute[1])();
          }
        }
        pOVar4 = (OSAttribute *)operator_new(0xa0);
        OSAttribute::OSAttribute(pOVar4,(bool)local_e8._M_impl._0_1_);
        ppOVar3 = std::
                  map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                  ::operator[](this_00,&local_58);
        break;
      case 2:
        bVar2 = File::readULong(&local_b0,(unsigned_long *)&local_e8);
        if (!bVar2) {
          softHSMLog(7,"refresh",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                     ,0x1a5,"Corrupt object file %s",(this->path)._M_dataplus._M_p);
          this->valid = false;
          File::unlock(&local_b0);
          goto LAB_00133736;
        }
        ppOVar3 = std::
                  map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                  ::operator[](this_00,&local_58);
        if (*ppOVar3 != (mapped_type)0x0) {
          ppOVar3 = std::
                    map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                    ::operator[](this_00,&local_58);
          if (*ppOVar3 != (mapped_type)0x0) {
            (*(*ppOVar3)->_vptr_OSAttribute[1])();
          }
        }
        pOVar4 = (OSAttribute *)operator_new(0xa0);
        OSAttribute::OSAttribute(pOVar4,local_e8._M_impl._0_8_);
        ppOVar3 = std::
                  map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                  ::operator[](this_00,&local_58);
        break;
      case 3:
        ByteString::ByteString((ByteString *)&local_e8);
        bVar2 = File::readByteString(&local_b0,(ByteString *)&local_e8);
        if (!bVar2) {
          softHSMLog(7,"refresh",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                     ,0x1bb,"Corrupt object file %s",(this->path)._M_dataplus._M_p);
          this->valid = false;
          File::unlock(&local_b0);
          local_e8._M_impl._0_8_ = local_b8;
          std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_> *)
                     &local_e8._M_impl.super__Rb_tree_header);
          goto LAB_00133736;
        }
        ppOVar3 = std::
                  map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                  ::operator[](this_00,&local_58);
        if (*ppOVar3 != (mapped_type)0x0) {
          ppOVar3 = std::
                    map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                    ::operator[](this_00,&local_58);
          if (*ppOVar3 != (mapped_type)0x0) {
            (*(*ppOVar3)->_vptr_OSAttribute[1])();
          }
        }
        pOVar4 = (OSAttribute *)operator_new(0xa0);
        OSAttribute::OSAttribute(pOVar4,(ByteString *)&local_e8);
        ppOVar3 = std::
                  map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                  ::operator[](this_00,&local_58);
        *ppOVar3 = pOVar4;
        local_e8._M_impl._0_8_ = local_b8;
        std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_> *)
                   &local_e8._M_impl.super__Rb_tree_header);
        goto LAB_001333c5;
      case 4:
        local_e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_e8._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_e8._M_impl.super__Rb_tree_header._M_header;
        local_e8._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_e8._M_impl.super__Rb_tree_header._M_header._M_right =
             local_e8._M_impl.super__Rb_tree_header._M_header._M_left;
        bVar2 = File::readAttributeMap
                          (&local_b0,
                           (map<unsigned_long,_OSAttribute,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
                            *)&local_e8);
        if (!bVar2) {
          softHSMLog(7,"refresh",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                     ,0x1e7,"Corrupt object file %s",(this->path)._M_dataplus._M_p);
          this->valid = false;
          File::unlock(&local_b0);
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_OSAttribute>,_std::_Select1st<std::pair<const_unsigned_long,_OSAttribute>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
          ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_OSAttribute>,_std::_Select1st<std::pair<const_unsigned_long,_OSAttribute>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
                       *)&local_e8);
          goto LAB_00133736;
        }
        ppOVar3 = std::
                  map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                  ::operator[](this_00,&local_58);
        if (*ppOVar3 != (mapped_type)0x0) {
          ppOVar3 = std::
                    map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                    ::operator[](this_00,&local_58);
          if (*ppOVar3 != (mapped_type)0x0) {
            (*(*ppOVar3)->_vptr_OSAttribute[1])();
          }
        }
        pOVar4 = (OSAttribute *)operator_new(0xa0);
        OSAttribute::OSAttribute
                  (pOVar4,(map<unsigned_long,_OSAttribute,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
                           *)&local_e8);
        ppOVar3 = std::
                  map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                  ::operator[](this_00,&local_58);
        *ppOVar3 = pOVar4;
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_OSAttribute>,_std::_Select1st<std::pair<const_unsigned_long,_OSAttribute>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
        ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_OSAttribute>,_std::_Select1st<std::pair<const_unsigned_long,_OSAttribute>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
                     *)&local_e8);
        goto LAB_001333c5;
      case 5:
        local_e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_e8._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_e8._M_impl.super__Rb_tree_header._M_header;
        local_e8._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_e8._M_impl.super__Rb_tree_header._M_header._M_right =
             local_e8._M_impl.super__Rb_tree_header._M_header._M_left;
        bVar2 = File::readMechanismTypeSet
                          (&local_b0,
                           (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                            *)&local_e8);
        if (bVar2) goto code_r0x001334c3;
        softHSMLog(7,"refresh",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                   ,0x1d1,"Corrupt object file %s",(this->path)._M_dataplus._M_p);
        this->valid = false;
        File::unlock(&local_b0);
        std::
        _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
        ::~_Rb_tree(&local_e8);
        goto LAB_00133736;
      default:
        softHSMLog(7,"refresh",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                   ,0x1f9,"Corrupt object file %s with unknown attribute of type %d",
                   (this->path)._M_dataplus._M_p,local_78);
        goto LAB_00133728;
      }
      *ppOVar3 = pOVar4;
      goto LAB_001333c5;
    }
LAB_001336ee:
    File::unlock(&local_b0);
    this->valid = true;
  }
  else {
    bVar2 = File::isEOF(&local_b0);
    if (bVar2) goto LAB_0013339f;
    softHSMLog(7,"refresh",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
               ,0x159,"Corrupt object file %s",(this->path)._M_dataplus._M_p);
    this->valid = false;
    File::unlock(&local_b0);
  }
LAB_00133736:
  MutexLocker::~MutexLocker(&local_68);
LAB_00133743:
  File::~File(&local_b0);
  return;
code_r0x001334c3:
  ppOVar3 = std::
            map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
            ::operator[](this_00,&local_58);
  if (*ppOVar3 != (mapped_type)0x0) {
    ppOVar3 = std::
              map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
              ::operator[](this_00,&local_58);
    if (*ppOVar3 != (mapped_type)0x0) {
      (*(*ppOVar3)->_vptr_OSAttribute[1])();
    }
  }
  pOVar4 = (OSAttribute *)operator_new(0xa0);
  OSAttribute::OSAttribute
            (pOVar4,(set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                    &local_e8);
  ppOVar3 = std::
            map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
            ::operator[](this_00,&local_58);
  *ppOVar3 = pOVar4;
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&local_e8);
  goto LAB_001333c5;
}

Assistant:

void ObjectFile::refresh(bool isFirstTime /* = false */)
{
	// Check if we're in the middle of a transaction
	if (inTransaction)
	{
		DEBUG_MSG("The object is in a transaction");

		return;
	}

	// Refresh the associated token if set
	if (!isFirstTime && (token != NULL))
	{
		// This may cause this instance to become invalid
		token->index();
	}

	// Check the generation
	if (!isFirstTime && (gen == NULL || !gen->wasUpdated()))
	{
		DEBUG_MSG("The object generation has not been updated");

		return;
	}

	File objectFile(path, umask);

	if (!objectFile.isValid())
	{
		DEBUG_MSG("Object %s is invalid", path.c_str());

		valid = false;

		return;
	}

	objectFile.lock();

	if (objectFile.isEmpty())
	{
		DEBUG_MSG("Object %s is empty", path.c_str());
		
		objectFile.unlock();

		return;
	}

	DEBUG_MSG("Object %s has changed", path.c_str());

	// Discard the existing set of attributes
	discardAttributes();

	MutexLocker lock(objectMutex);

	// Read back the generation number
	unsigned long curGen;

	if (!objectFile.readULong(curGen))
	{
		if (!objectFile.isEOF())
		{
			DEBUG_MSG("Corrupt object file %s", path.c_str());

			valid = false;

			objectFile.unlock();

			return;
		}
	}
	else
	{
		gen->set(curGen);
	}

	// Read back the attributes
	while (!objectFile.isEOF())
	{
		unsigned long p11AttrType;
		unsigned long osAttrType;

		if (!objectFile.readULong(p11AttrType))
		{
			if (objectFile.isEOF())
			{
				break;
			}

			DEBUG_MSG("Corrupt object file %s", path.c_str());

			valid = false;

			objectFile.unlock();

			return;
		}

		if (!objectFile.readULong(osAttrType))
		{
			DEBUG_MSG("Corrupt object file %s", path.c_str());

			valid = false;

			objectFile.unlock();

			return;
		}

		// Depending on the type, read back the actual value
		if (osAttrType == BOOLEAN_ATTR)
		{
			bool value;

			if (!objectFile.readBool(value))
			{
				DEBUG_MSG("Corrupt object file %s", path.c_str());

				valid = false;

				objectFile.unlock();

				return;
			}

			if (attributes[p11AttrType] != NULL)
			{
				delete attributes[p11AttrType];
			}

			attributes[p11AttrType] = new OSAttribute(value);
		}
		else if (osAttrType == ULONG_ATTR)
		{
			unsigned long value;

			if (!objectFile.readULong(value))
			{
				DEBUG_MSG("Corrupt object file %s", path.c_str());

				valid = false;

				objectFile.unlock();

				return;
			}

			if (attributes[p11AttrType] != NULL)
			{
				delete attributes[p11AttrType];
			}

			attributes[p11AttrType] = new OSAttribute(value);
		}
		else if (osAttrType == BYTESTR_ATTR)
		{
			ByteString value;

			if (!objectFile.readByteString(value))
			{
				DEBUG_MSG("Corrupt object file %s", path.c_str());

				valid = false;

				objectFile.unlock();

				return;
			}

			if (attributes[p11AttrType] != NULL)
			{
				delete attributes[p11AttrType];
			}

			attributes[p11AttrType] = new OSAttribute(value);
		}
		else if (osAttrType == MECHSET_ATTR)
		{
			std::set<CK_MECHANISM_TYPE> value;

			if (!objectFile.readMechanismTypeSet(value))
			{
				DEBUG_MSG("Corrupt object file %s", path.c_str());

				valid = false;

				objectFile.unlock();

				return;
			}

			if (attributes[p11AttrType] != NULL)
			{
				delete attributes[p11AttrType];
			}

			attributes[p11AttrType] = new OSAttribute(value);
		}
		else if (osAttrType == ATTRMAP_ATTR)
		{
			std::map<CK_ATTRIBUTE_TYPE,OSAttribute> value;

			if (!objectFile.readAttributeMap(value))
			{
				DEBUG_MSG("Corrupt object file %s", path.c_str());

				valid = false;

				objectFile.unlock();

				return;
			}

			if (attributes[p11AttrType] != NULL)
			{
				delete attributes[p11AttrType];
			}

			attributes[p11AttrType] = new OSAttribute(value);
		}
		else
		{
			DEBUG_MSG("Corrupt object file %s with unknown attribute of type %d", path.c_str(), osAttrType);

			valid = false;

			objectFile.unlock();

			return;
		}
	}

	objectFile.unlock();

	valid = true;
}